

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O0

tnt_error tnt_io_resolve(addrinfo **addr_info_p,char *hostname,char *port)

{
  int iVar1;
  undefined1 local_60 [8];
  addrinfo hints;
  addrinfo *addr_info;
  char *port_local;
  char *hostname_local;
  addrinfo **addr_info_p_local;
  
  hints.ai_next = (addrinfo *)0x0;
  memset(local_60,0,0x30);
  hints.ai_flags = 1;
  hints.ai_family = 6;
  iVar1 = getaddrinfo(hostname,port,(addrinfo *)local_60,(addrinfo **)&hints.ai_next);
  if ((iVar1 == 0) && (hints.ai_next != (addrinfo *)0x0)) {
    *addr_info_p = hints.ai_next;
    addr_info_p_local._4_4_ = TNT_EOK;
  }
  else {
    addr_info_p_local._4_4_ = TNT_ERESOLVE;
  }
  return addr_info_p_local._4_4_;
}

Assistant:

static enum tnt_error
tnt_io_resolve(struct addrinfo **addr_info_p,
	       const char *hostname, const char *port)
{
	struct addrinfo *addr_info = NULL;
	struct addrinfo hints;
	memset(&hints, 0, sizeof(hints));
	hints.ai_socktype = SOCK_STREAM;
	hints.ai_protocol = IPPROTO_TCP;
	if (getaddrinfo(hostname, port, &hints, &addr_info) == 0 &&
	    addr_info != NULL) {
		*addr_info_p = addr_info;
		return TNT_EOK;
	}
	return TNT_ERESOLVE;
}